

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O0

void Curl_uint_hash_visit(uint_hash *h,Curl_uint_hash_visit_cb *cb,void *user_data)

{
  _Bool _Var1;
  ulong local_30;
  size_t i;
  uint_hash_entry *he;
  void *user_data_local;
  Curl_uint_hash_visit_cb *cb_local;
  uint_hash *h_local;
  
  if (((h != (uint_hash *)0x0) && (h->table != (uint_hash_entry **)0x0)) &&
     (cb != (Curl_uint_hash_visit_cb *)0x0)) {
    for (local_30 = 0; local_30 < h->slots; local_30 = local_30 + 1) {
      for (i = (size_t)h->table[local_30]; i != 0; i = *(size_t *)i) {
        _Var1 = (*cb)(*(uint *)(i + 0x10),*(void **)(i + 8),user_data);
        if (!_Var1) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_uint_hash_visit(struct uint_hash *h,
                          Curl_uint_hash_visit_cb *cb,
                          void *user_data)
{
  if(h && h->table && cb) {
    struct uint_hash_entry *he;
    size_t i;
    DEBUGASSERT(h->init == CURL_UINTHASHINIT);
    for(i = 0; i < h->slots; ++i) {
      for(he = h->table[i]; he; he = he->next) {
        if(!cb(he->id, he->value, user_data))
          return;
      }
    }
  }
}